

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

QRect __thiscall QMenuBarPrivate::menuRect(QMenuBarPrivate *this,bool extVisible)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  Data *pDVar4;
  QObject *pQVar5;
  uint uVar6;
  LayoutDirection LVar7;
  int iVar8;
  QStyle *pQVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  int iVar11;
  QRect QVar12;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar9 = QWidget::style(this_00);
  uVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x21,0,this_00);
  uVar10 = (ulong)uVar6;
  pQVar3 = this_00->data;
  iVar1 = (pQVar3->crect).y1.m_i;
  iVar2 = (pQVar3->crect).y2.m_i;
  iVar11 = (pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + uVar6);
  if ((int)CONCAT71(in_register_00000031,extVisible) != 0) {
    uVar10 = (ulong)uVar6;
    LVar7 = QWidget::layoutDirection(this_00);
    iVar8 = (**(code **)(*(long *)&(this->extension->super_QToolButton).super_QAbstractButton.
                                   super_QWidget + 0x70))();
    if (LVar7 == RightToLeft) {
      uVar10 = (ulong)(uVar6 + iVar8);
    }
    else {
      iVar11 = iVar11 - iVar8;
    }
  }
  pDVar4 = (this->leftWidget).wp.d;
  if (pDVar4 != (Data *)0x0) {
    pQVar5 = (this->leftWidget).wp.value;
    if ((pQVar5 != (QObject *)0x0 && *(int *)(pDVar4 + 4) != 0) &&
       ((*(byte *)(*(long *)(pQVar5 + 0x20) + 9) & 0x80) != 0)) {
      iVar8 = (**(code **)(*(long *)pQVar5 + 0x70))();
      LVar7 = QWidget::layoutDirection(this_00);
      if (LVar7 == RightToLeft) {
        iVar11 = iVar11 - iVar8;
      }
      else {
        uVar10 = (ulong)(uint)((int)uVar10 + iVar8);
      }
    }
  }
  pDVar4 = (this->rightWidget).wp.d;
  if (pDVar4 != (Data *)0x0) {
    pQVar5 = (this->rightWidget).wp.value;
    if ((pQVar5 != (QObject *)0x0 && *(int *)(pDVar4 + 4) != 0) &&
       ((*(byte *)(*(long *)(pQVar5 + 0x20) + 9) & 0x80) != 0)) {
      iVar8 = (**(code **)(*(long *)pQVar5 + 0x70))();
      LVar7 = QWidget::layoutDirection(this_00);
      if (LVar7 == RightToLeft) {
        uVar10 = (ulong)(uint)((int)uVar10 + iVar8);
      }
      else {
        iVar11 = iVar11 - iVar8;
      }
    }
  }
  QVar12.y2.m_i = iVar2 - iVar1;
  QVar12.x2.m_i = iVar11;
  QVar12.x1.m_i = (int)uVar10;
  QVar12.y1.m_i = (int)(uVar10 >> 0x20);
  return QVar12;
}

Assistant:

QRect QMenuBarPrivate::menuRect(bool extVisible) const
{
    Q_Q(const QMenuBar);

    int hmargin = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    QRect result = q->rect();
    result.adjust(hmargin, 0, -hmargin, 0);

    if (extVisible) {
        if (q->isRightToLeft())
            result.setLeft(result.left() + extension->sizeHint().width());
        else
            result.setWidth(result.width() - extension->sizeHint().width());
    }

    if (leftWidget && leftWidget->isVisible()) {
        QSize sz = leftWidget->sizeHint();
        if (q->isRightToLeft())
            result.setRight(result.right() - sz.width());
        else
            result.setLeft(result.left() + sz.width());
    }

    if (rightWidget && rightWidget->isVisible()) {
        QSize sz = rightWidget->sizeHint();
        if (q->isRightToLeft())
            result.setLeft(result.left() + sz.width());
        else
            result.setRight(result.right() - sz.width());
    }

    return result;
}